

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

curl_slist * Curl_cookie_list(Curl_easy *data)

{
  Curl_llist_node *n;
  Cookie *co;
  char *data_00;
  curl_slist *pcVar1;
  long lVar2;
  curl_slist *list;
  
  Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
  if ((data->cookies == (CookieInfo *)0x0) || (data->cookies->numcookies == 0)) {
LAB_0011f0a8:
    list = (curl_slist *)0x0;
  }
  else {
    lVar2 = 0;
    list = (curl_slist *)0x0;
    do {
      n = Curl_llist_head(data->cookies->cookielist + lVar2);
      while (n != (Curl_llist_node *)0x0) {
        co = (Cookie *)Curl_node_elem(n);
        pcVar1 = list;
        if (co->domain != (char *)0x0) {
          data_00 = get_netscape_format(co);
          if (data_00 != (char *)0x0) {
            pcVar1 = Curl_slist_append_nodup(list,data_00);
            if (pcVar1 != (curl_slist *)0x0) goto LAB_0011f06e;
            (*Curl_cfree)(data_00);
          }
          curl_slist_free_all(list);
          goto LAB_0011f0a8;
        }
LAB_0011f06e:
        n = Curl_node_next(n);
        list = pcVar1;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x3f);
  }
  Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
  return list;
}

Assistant:

struct curl_slist *Curl_cookie_list(struct Curl_easy *data)
{
  struct curl_slist *list;
  Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
  list = cookie_list(data);
  Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
  return list;
}